

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3b63a::extractDataPart
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *bstring)

{
  size_type i;
  uint64_t uVar1;
  ulong uVar2;
  allocator_type local_39;
  string dpstr;
  
  uVar1 = findSeparatorPosition(bstring);
  std::__cxx11::string::substr((ulong)&dpstr,(ulong)bstring);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,bstring->_M_string_length - (uVar1 + 1),&local_39);
  for (uVar2 = 0; uVar2 < dpstr._M_string_length; uVar2 = uVar2 + 1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar2] = dpstr._M_dataplus._M_p[uVar2];
  }
  std::__cxx11::string::~string((string *)&dpstr);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> extractDataPart(const std::string & bstring) {
        auto pos = findSeparatorPosition(bstring);
        std::string dpstr = bstring.substr(pos+1);
        // convert dpstr to dp vector
        std::vector<unsigned char> dp(bstring.size() - (pos + 1));
        for(std::string::size_type i = 0; i < dpstr.size(); ++i) {
            dp[i] = static_cast<unsigned char>(dpstr[i]);
        }
        return dp;
    }